

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void cvtpi2ps_(PDISASM pMyDisasm)

{
  Int32 IVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
      failDecode(pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      failDecode(pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vcvtsi2ss");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).REX.W_ != '\0'))
         && (((pMyDisasm->Reserved_).EVEX.state != '\x01' || ((pMyDisasm->Reserved_).EVEX.W != '\0')
             ))) {
        (pMyDisasm->Reserved_).MemDecoration = 0xcc;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      }
      IVar1 = 0x110000;
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        IVar1 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar1;
      (pMyDisasm->Reserved_).Register_ = 4;
      GyEy(pMyDisasm);
    }
    else {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vcvtsi2sd");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).REX.W_ != '\0'))
         && (((pMyDisasm->Reserved_).EVEX.state != '\x01' || ((pMyDisasm->Reserved_).EVEX.W != '\0')
             ))) {
        (pMyDisasm->Reserved_).MemDecoration = 0xcc;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      }
      IVar1 = 0x110000;
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        IVar1 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar1;
      (pMyDisasm->Reserved_).Register_ = 4;
      GyEy(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Reserved_).PrefRepne == 1) {
    (pMyDisasm->Prefix).RepnePrefix = '\b';
    (pMyDisasm->Instruction).Category = 0x50014;
    strcpy((pMyDisasm->Instruction).Mnemonic,"cvtsi2sd");
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    }
  }
  else if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    (pMyDisasm->Prefix).RepPrefix = '\b';
    (pMyDisasm->Instruction).Category = 0x50014;
    strcpy((pMyDisasm->Instruction).Mnemonic,"cvtsi2ss");
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Instruction).Category = 0x50014;
    strcpy((pMyDisasm->Instruction).Mnemonic,"cvtpi2pd");
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Reserved_).Register_ = 2;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x50014;
    strcpy((pMyDisasm->Instruction).Mnemonic,"cvtpi2ps");
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Reserved_).Register_ = 2;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  return;
}

Assistant:

void __bea_callspec__ cvtpi2ps_(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 1) {
     failDecode(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtsi2ss");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
     if (
       ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
       ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
     ){
       GV.MemDecoration = Arg3dword;
     }
     else {
       GV.MemDecoration = Arg3qword;
     }
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     GV.Register_ = SSE_REG;
     GyEy(pMyDisasm);


   }
   else {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtsi2sd");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
     if (
       ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
       ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
     ){
       GV.MemDecoration = Arg3dword;
     }
     else {
       GV.MemDecoration = Arg3qword;
     }
     pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
     GV.Register_ = SSE_REG;
     GyEy(pMyDisasm);


   }
 }
 else {
   /* ========= 0xf2 */
   if (GV.PrefRepne == 1) {
       pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtsi2sd");
       #endif
       if (GV.REX.W_ == 1) {
           GV.MemDecoration = Arg2qword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
       else {
           GV.MemDecoration = Arg2dword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
   }
   /* ========== 0xf3 */
   else if (GV.PrefRepe == 1) {
       pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtsi2ss");
       #endif
       if (GV.REX.W_ == 1) {
           GV.MemDecoration = Arg2qword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
       else {
           GV.MemDecoration = Arg2dword;
           decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
           GV.Register_ = SSE_REG;
           decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

           GV.EIP_+= GV.DECALAGE_EIP+2;
       }
   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtpi2pd");
       #endif
       GV.MemDecoration = Arg2qword;
       GV.Register_ = MMX_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);

       GV.Register_ = SSE_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

       GV.EIP_+= GV.DECALAGE_EIP+2;
   }
   else {
       pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CONVERSION_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cvtpi2ps");
       #endif
       GV.MemDecoration = Arg2qword;
       GV.Register_ = MMX_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);

       GV.Register_ = SSE_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

       GV.EIP_+= GV.DECALAGE_EIP+2;
   }
 }
}